

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_DrawPlayerSprites(void)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  F3DFloor *pFVar3;
  secplane_t *psVar4;
  sector_t *psVar5;
  int iVar6;
  sector_t_conflict *psVar7;
  DPSprite *pDVar8;
  AActor *pAVar9;
  uint uVar10;
  sector_t *psVar11;
  TObjPtr<DPSprite> *obj;
  uint uVar12;
  int ceilinglight;
  int floorlight;
  float boby;
  float bobx;
  undefined8 local_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  if ((R_DrawPlayerSprites()::tempsec == '\0') &&
     (iVar6 = __cxa_guard_acquire(&R_DrawPlayerSprites()::tempsec), iVar6 != 0)) {
    __cxa_guard_release(&R_DrawPlayerSprites()::tempsec);
  }
  if (((((camera != (AActor *)0x0 & r_drawplayersprites.Value) == 1) &&
       (camera->player != (player_t *)0x0)) &&
      (((&DAT_017dc068)[(long)consoleplayer * 0x2a0] & 0x20) == 0)) &&
     ((r_deathcamera.Value != true || (0 < camera->health)))) {
    if ((fixedlightlev < 0) &&
       ((peVar1 = viewsector->e, peVar1 != (extsector_t *)0x0 &&
        (uVar10 = (peVar1->XFloor).lightlist.Count, uVar10 != 0)))) {
      do {
        uVar10 = uVar10 - 1;
        psVar5 = viewsector;
        if ((int)uVar10 < 0) goto LAB_00314c46;
        uVar12 = uVar10 & 0x7fffffff;
        plVar2 = (peVar1->XFloor).lightlist.Array;
      } while (plVar2[uVar12].plane.D * plVar2[uVar12].plane.negiC < ViewPos.Z);
      pFVar3 = plVar2[uVar12].caster;
      if (((pFVar3 == (F3DFloor *)0x0) ||
          ((((pFVar3->flags >> 0x10 & 1) != 0 &&
            (psVar4 = (pFVar3->bottom).plane, ViewPos.Z <= psVar4->D * psVar4->negiC)) ||
           (psVar11 = pFVar3->model, psVar5 = psVar11, (pFVar3->flags >> 0x1b & 1) != 0)))) ||
         (basecolormap = plVar2[uVar12].extra_colormap, psVar5 = viewsector,
         psVar11 == (sector_t *)0x0)) {
LAB_00314c46:
        psVar11 = psVar5;
        basecolormap = psVar11->ColorMap;
      }
      ceilinglight = (int)psVar11->lightlevel;
      floorlight = ceilinglight;
    }
    else {
      psVar7 = R_FakeFlat((sector_t_conflict *)viewsector,&R_DrawPlayerSprites::tempsec,&floorlight,
                          &ceilinglight,false);
      basecolormap = psVar7->ColorMap;
    }
    foggy = '\x01';
    if ((level.fadeto == 0) && ((basecolormap->Fade).field_0.d == 0)) {
      foggy = (char)((level.flags & 8) >> 3);
    }
    r_actualextralight = 0;
    if (foggy == '\0') {
      r_actualextralight = extralight << 4;
    }
    spriteshade = (((uint)(ceilinglight + floorlight) >> 1) + r_actualextralight) * -0x4000 +
                  0x250000;
    mfloorclip = &screenheightarray;
    mceilingclip = &zeroarray;
    if (camera->player != (player_t *)0x0) {
      local_50 = CenterY;
      CenterY = (double)(viewheight / 2);
      P_BobWeapon(camera->player,&bobx,&boby,r_TicFracF);
      pDVar8 = player_t::FindPSprite(camera->player,1);
      if (pDVar8 == (DPSprite *)0x0) {
        local_38 = 0.0;
        local_48 = 0.0;
      }
      else if (pDVar8->firstTic == true) {
        local_38 = pDVar8->x;
        local_48 = pDVar8->y;
      }
      else {
        local_38 = r_TicFracF * (pDVar8->x - pDVar8->oldx) + pDVar8->oldx;
        local_48 = r_TicFracF * (pDVar8->y - pDVar8->oldy) + pDVar8->oldy;
      }
      obj = &camera->player->psprites;
      dStack_40 = local_48;
      dStack_30 = local_48;
      while (pDVar8 = GC::ReadBarrier<DPSprite>((DPSprite **)obj), pDVar8 != (DPSprite *)0x0) {
        if (((pDVar8->ID != 0x7ffffffd) || (CrosshairImage == (FTexture *)0x0)) &&
           (pAVar9 = GC::ReadBarrier<AActor>((AActor **)&pDVar8->Caller), pAVar9 != (AActor *)0x0))
        {
          R_DrawPSprite(pDVar8,camera,bobx,boby,local_38,local_48,r_TicFracF);
        }
        obj = &pDVar8->Next;
      }
      CenterY = (double)local_50;
    }
  }
  return;
}

Assistant:

void R_DrawPlayerSprites ()
{
	int 		i;
	int 		lightnum;
	DPSprite*	psp;
	DPSprite*	weapon;
	sector_t*	sec = NULL;
	static sector_t tempsec;
	int			floorlight, ceilinglight;
	F3DFloor *rover;

	if (!r_drawplayersprites ||
		!camera ||
		!camera->player ||
		(players[consoleplayer].cheats & CF_CHASECAM) ||
		(r_deathcamera && camera->health <= 0))
		return;

	if (fixedlightlev < 0 && viewsector->e && viewsector->e->XFloor.lightlist.Size())
	{
		for (i = viewsector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (ViewPos.Z <= viewsector->e->XFloor.lightlist[i].plane.Zat0())
			{
				rover = viewsector->e->XFloor.lightlist[i].caster;
				if (rover)
				{
					if (rover->flags & FF_DOUBLESHADOW && ViewPos.Z <= rover->bottom.plane->Zat0())
						break;
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
						basecolormap = sec->ColorMap;
					else
						basecolormap = viewsector->e->XFloor.lightlist[i].extra_colormap;
				}
				break;
			}
		}
		if(!sec)
		{
			sec = viewsector;
			basecolormap = sec->ColorMap;
		}
		floorlight = ceilinglight = sec->lightlevel;
	}
	else
	{	// This used to use camera->Sector but due to interpolation that can be incorrect
		// when the interpolated viewpoint is in a different sector than the camera.
		sec = R_FakeFlat (viewsector, &tempsec, &floorlight,
			&ceilinglight, false);

		// [RH] set basecolormap
		basecolormap = sec->ColorMap;
	}

	// [RH] set foggy flag
	foggy = (level.fadeto || basecolormap->Fade || (level.flags & LEVEL_HASFADETABLE));
	r_actualextralight = foggy ? 0 : extralight << 4;

	// get light level
	lightnum = ((floorlight + ceilinglight) >> 1) + r_actualextralight;
	spriteshade = LIGHT2SHADE(lightnum) - 24*FRACUNIT;

	// clip to screen bounds
	mfloorclip = screenheightarray;
	mceilingclip = zeroarray;

	if (camera->player != NULL)
	{
		double centerhack = CenterY;
		double wx, wy;
		float bobx, boby;

		CenterY = viewheight / 2;

		P_BobWeapon (camera->player, &bobx, &boby, r_TicFracF);

		// Interpolate the main weapon layer once so as to be able to add it to other layers.
		if ((weapon = camera->player->FindPSprite(PSP_WEAPON)) != nullptr)
		{
			if (weapon->firstTic)
			{
				wx = weapon->x;
				wy = weapon->y;
			}
			else
			{
				wx = weapon->oldx + (weapon->x - weapon->oldx) * r_TicFracF;
				wy = weapon->oldy + (weapon->y - weapon->oldy) * r_TicFracF;
			}
		}
		else
		{
			wx = 0;
			wy = 0;
		}

		// add all active psprites
		psp = camera->player->psprites;
		while (psp)
		{
			// [RH] Don't draw the targeter's crosshair if the player already has a crosshair set.
			// It's possible this psprite's caller is now null but the layer itself hasn't been destroyed
			// because it didn't tick yet (if we typed 'take all' while in the console for example).
			// In this case let's simply not draw it to avoid crashing.
			if ((psp->GetID() != PSP_TARGETCENTER || CrosshairImage == nullptr) && psp->GetCaller() != nullptr)
			{
				R_DrawPSprite(psp, camera, bobx, boby, wx, wy, r_TicFracF);
			}

			psp = psp->GetNext();
		}

		CenterY = centerhack;
	}
}